

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

MPP_RET vp8d_parser_parse(void *ctx,HalDecTask *in_task)

{
  uint uVar1;
  FILE *pFVar2;
  char local_138 [8];
  char name [256];
  VP8DParserContext_t *p;
  VP8DContext *c;
  MPP_RET ret;
  HalDecTask *in_task_local;
  void *ctx_local;
  
  name._248_8_ = *ctx;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x508,
               "vp8d_parser_parse");
  }
  ctx_local._4_4_ =
       decoder_frame_header
                 ((VP8DParserContext_t *)name._248_8_,*(RK_U8 **)(name._248_8_ + 8),
                  *(RK_U32 *)(name._248_8_ + 0x14));
  if (ctx_local._4_4_ == MPP_OK) {
    vp8hwdSetPartitionOffsets
              ((VP8DParserContext_t *)name._248_8_,*(RK_U8 **)(name._248_8_ + 8),
               *(RK_U32 *)(name._248_8_ + 0x14));
    ctx_local._4_4_ = vp8d_alloc_frame((VP8DParserContext_t *)name._248_8_);
    if (ctx_local._4_4_ == MPP_OK) {
      vp8d_convert_to_syntx((VP8DParserContext_t *)name._248_8_,in_task);
      if (*(int *)(name._248_8_ + 0xcc) == 0) {
        memcpy((void *)(name._248_8_ + 0x194),(void *)(name._248_8_ + 0x5e1),0x44d);
        memcpy((void *)(name._248_8_ + 0xf8),(void *)(name._248_8_ + 0x138),0x40);
      }
      (in_task->syntax).data = *(void **)name._248_8_;
      (in_task->syntax).number = 1;
      in_task->output = *(RK_S32 *)(*(long *)(name._248_8_ + 0x18) + 8);
      in_task->valid = 1;
      if (*(int *)(name._248_8_ + 0xab8) != 0) {
        (in_task->flags).val =
             (in_task->flags).val & 0xfffffffffffffffe | (ulong)*(uint *)(name._248_8_ + 0xab8) & 1;
      }
      vp8d_ref_update((VP8DParserContext_t *)name._248_8_);
      if ((vp8d_debug & 0x1000) != 0) {
        if (*(long *)(name._248_8_ + 0xad0) == 0) {
          uVar1 = getpid();
          sprintf(local_138,"/data/video/mpp_dec_vp8_%d.bin",(ulong)uVar1);
          pFVar2 = fopen(local_138,"wb");
          *(FILE **)(name._248_8_ + 0xad0) = pFVar2;
        }
        if (*(long *)(name._248_8_ + 0xad0) != 0) {
          if (*(int *)(name._248_8_ + 0xad8) == 0) {
            write_ivf_header((VP8DParserContext_t *)name._248_8_,*(FILE **)(name._248_8_ + 0xad0));
            *(undefined4 *)(name._248_8_ + 0xad8) = 1;
          }
          write_ivf_frame(*(FILE **)(name._248_8_ + 0xad0),*(RK_U32 *)(name._248_8_ + 0x14),
                          (ulong)*(uint *)(name._248_8_ + 0xa98));
          fwrite(*(void **)(name._248_8_ + 8),1,(ulong)*(uint *)(name._248_8_ + 0x14),
                 *(FILE **)(name._248_8_ + 0xad0));
          fflush(*(FILE **)(name._248_8_ + 0xad0));
        }
      }
      *(int *)(name._248_8_ + 0xa98) = *(int *)(name._248_8_ + 0xa98) + 1;
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x53f,
                   "vp8d_parser_parse");
      }
    }
    else {
      _mpp_log_l(2,"vp8d_parser","vp8d_alloc_frame err ret %d",(char *)0x0,
                 (ulong)(uint)ctx_local._4_4_);
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x517,
                   "vp8d_parser_parse");
      }
    }
  }
  else {
    _mpp_log_l(2,"vp8d_parser","decoder_frame_header err ret %d",(char *)0x0,
               (ulong)(uint)ctx_local._4_4_);
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x50e,
                 "vp8d_parser_parse");
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET vp8d_parser_parse(void *ctx, HalDecTask *in_task)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;
    FUN_T("FUN_IN");

    ret = decoder_frame_header(p, p->bitstream_sw_buf, p->stream_size);

    if (MPP_OK != ret) {
        mpp_err("decoder_frame_header err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8hwdSetPartitionOffsets(p, p->bitstream_sw_buf, p->stream_size);

    ret = vp8d_alloc_frame(p);
    if (MPP_OK != ret) {
        mpp_err("vp8d_alloc_frame err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8d_convert_to_syntx(p, in_task);
    /* Rollback entropy probabilities if refresh is not set */
    if (p->refreshEntropyProbs == 0) {
        memcpy((void*)&p->entropy, (void*)&p->entropyLast,
               (unsigned long)sizeof(vp8EntropyProbs_t));
        memcpy((void*)p->vp7ScanOrder, (void*)p->vp7PrevScanOrder,
               (unsigned long)sizeof(p->vp7ScanOrder));
    }
    in_task->syntax.data = (void *)p->dxva_ctx;
    in_task->syntax.number = 1;
    in_task->output = p->frame_out->slot_index;
    in_task->valid = 1;
    if (p->eos) {
        in_task->flags.eos = p->eos;
    }
    vp8d_ref_update(p);

    if (vp8d_debug & VP8D_DBG_DUMP_STREAM) {
        if (!p->stream_fp) {
            char name[256];

            sprintf(name, "/data/video/mpp_dec_vp8_%d.bin", getpid());
            p->stream_fp = fopen(name, "wb");
        }
        if (p->stream_fp) {
            if (!p->ivf_header_flag) {
                write_ivf_header(p, p->stream_fp);
                p->ivf_header_flag = 1;
            }
            write_ivf_frame(p->stream_fp, p->stream_size, p->frame_cnt);
            fwrite(p->bitstream_sw_buf, 1, p->stream_size, p->stream_fp);
            fflush(p->stream_fp);
        }
    }
    p->frame_cnt++;

    FUN_T("FUN_OUT");
    return ret;
}